

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CholeskyDecomposition.hpp
# Opt level: O1

void OpenMD::CholeskyDecomposition<OpenMD::SquareMatrix<double,6>>
               (SquareMatrix<double,_6> *A,SquareMatrix<double,_6> *L)

{
  double dVar1;
  uint i;
  long lVar2;
  double *pdVar3;
  double (*padVar4) [6];
  double (*padVar5) [6];
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Vector<double,_6U> result;
  double local_68 [7];
  
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  lVar2 = 0;
  pdVar3 = (double *)A;
  do {
    dVar10 = pdVar3[7];
    local_68[lVar2] = *pdVar3;
    local_68[lVar2 + 1] = dVar10;
    lVar2 = lVar2 + 2;
    pdVar3 = pdVar3 + 0xe;
  } while (lVar2 != 6);
  lVar2 = 0;
  do {
    local_68[lVar2] = ABS(local_68[lVar2]);
    local_68[lVar2 + 1] = ABS(local_68[lVar2 + 1]);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 6);
  lVar2 = 0;
  dVar10 = local_68[0];
  do {
    dVar11 = local_68[lVar2];
    if (local_68[lVar2] <= dVar10) {
      dVar11 = dVar10;
    }
    lVar2 = lVar2 + 1;
    dVar10 = dVar11;
  } while (lVar2 != 6);
  uVar8 = 0;
  padVar5 = (double (*) [6])L;
  do {
    dVar10 = 0.0;
    if (uVar8 != 0) {
      uVar6 = 0;
      padVar4 = (double (*) [6])L;
      do {
        dVar9 = 0.0;
        if (uVar6 != 0) {
          uVar7 = 0;
          do {
            dVar9 = dVar9 + ((RectMatrix<double,_6U,_6U> *)*padVar4)->data_[0][uVar7] *
                            ((RectMatrix<double,_6U,_6U> *)*padVar5)->data_[0][uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        dVar1 = *(double *)((long)(L->super_RectMatrix<double,_6U,_6U>).data_ + uVar6 * 0x38);
        dVar9 = (A->super_RectMatrix<double,_6U,_6U>).data_[uVar8][uVar6] - dVar9;
        uVar7 = -(ulong)((dVar11 * 2.220446049250313e-16) / 100.0 < ABS(dVar1));
        dVar9 = (double)(~uVar7 & (ulong)dVar9 | (ulong)(dVar9 / dVar1) & uVar7);
        (L->super_RectMatrix<double,_6U,_6U>).data_[uVar8][uVar6] = dVar9;
        dVar10 = dVar10 + dVar9 * dVar9;
        uVar6 = uVar6 + 1;
        padVar4 = padVar4 + 1;
      } while (uVar6 != uVar8);
    }
    dVar10 = *(double *)((long)(A->super_RectMatrix<double,_6U,_6U>).data_ + uVar8 * 0x38) - dVar10;
    if (dVar10 <= 0.0) {
      dVar10 = 0.0;
    }
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    *(double *)((long)(L->super_RectMatrix<double,_6U,_6U>).data_ + uVar8 * 0x38) = dVar10;
    if (uVar8 < 5) {
      memset((void *)((long)(L->super_RectMatrix<double,_6U,_6U>).data_ + uVar8 * 0x38 + 8),0,
             (uVar8 * -8 + 0x20 & 0x7fffffff8) + 8);
    }
    uVar8 = uVar8 + 1;
    padVar5 = padVar5 + 1;
  } while (uVar8 != 6);
  return;
}

Assistant:

void CholeskyDecomposition(MatrixType& A, MatrixType& L) {
    unsigned int n = A.getNRow();
    assert(n == A.getNCol() && n == L.getNRow() && n == L.getNCol());

    bool isspd(true);
    RealType eps =
        A.diagonals().abs().max() * (numeric_limits<RealType>::epsilon()) / 100;

    for (unsigned int j = 0; j < n; j++) {
      RealType d(0.0);
      for (unsigned int k = 0; k < j; k++) {
        RealType s(0.0);

        for (unsigned int i = 0; i < k; i++) {
          s += L(k, i) * L(j, i);
        }

        // if L(k,k) != 0
        if (std::abs(L(k, k)) > eps) {
          s = (A(j, k) - s) / L(k, k);
        } else {
          s     = (A(j, k) - s);
          isspd = false;
        }
        L(j, k) = s;
        d       = d + s * s;

        // this is approximately doing: isspd = isspd && ( A(k,j) == A(j,k) )
        isspd = isspd && (abs(A(k, j) - A(j, k)) < eps);
      }
      d       = A(j, j) - d;
      isspd   = isspd && (d > eps);
      L(j, j) = sqrt(d > 0.0 ? d : 0.0);
      for (unsigned int k = j + 1; k < n; k++) {
        L(j, k) = 0.0;
      }
    }
  }